

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

bool __thiscall spvtools::opt::Module::HasExplicitCapability(Module *this,uint32_t cap)

{
  uint32_t uVar1;
  Instruction *pIVar2;
  Instruction *ci;
  Instruction *this_00;
  bool bVar3;
  
  this_00 = (this->capabilities_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  pIVar2 = &(this->capabilities_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  if (this_00 == pIVar2) {
    bVar3 = false;
  }
  else {
    do {
      uVar1 = Instruction::GetSingleWordOperand(this_00,0);
      bVar3 = uVar1 == cap;
      if (bVar3) {
        return bVar3;
      }
      this_00 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (this_00 != pIVar2);
  }
  return bVar3;
}

Assistant:

bool Module::HasExplicitCapability(uint32_t cap) {
  for (auto& ci : capabilities_) {
    uint32_t tcap = ci.GetSingleWordOperand(0);
    if (tcap == cap) {
      return true;
    }
  }
  return false;
}